

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntercomControlPdu.cpp
# Opt level: O0

void __thiscall DIS::IntercomControlPdu::marshal(IntercomControlPdu *this,DataStream *dataStream)

{
  undefined8 uVar1;
  size_type sVar2;
  const_reference pvVar3;
  undefined1 local_30 [8];
  IntercomCommunicationsParameters x;
  size_t idx;
  DataStream *dataStream_local;
  IntercomControlPdu *this_local;
  
  RadioCommunicationsFamilyPdu::marshal(&this->super_RadioCommunicationsFamilyPdu,dataStream);
  DataStream::operator<<(dataStream,(this->super_RadioCommunicationsFamilyPdu).field_0x2a);
  DataStream::operator<<(dataStream,(this->super_RadioCommunicationsFamilyPdu).field_0x2b);
  EntityID::marshal(&this->_sourceEntityID,dataStream);
  DataStream::operator<<(dataStream,this->_sourceCommunicationsDeviceID);
  DataStream::operator<<(dataStream,this->_sourceLineID);
  DataStream::operator<<(dataStream,this->_transmitPriority);
  DataStream::operator<<(dataStream,this->_transmitLineState);
  DataStream::operator<<(dataStream,this->_command);
  EntityID::marshal(&this->_masterEntityID,dataStream);
  DataStream::operator<<(dataStream,this->_masterCommunicationsDeviceID);
  sVar2 = std::
          vector<DIS::IntercomCommunicationsParameters,_std::allocator<DIS::IntercomCommunicationsParameters>_>
          ::size(&this->_intercomParameters);
  DataStream::operator<<(dataStream,(uint)sVar2);
  x._recordType = 0;
  x._recordLength = 0;
  x._recordSpecificField = 0;
  while( true ) {
    uVar1 = x._8_8_;
    sVar2 = std::
            vector<DIS::IntercomCommunicationsParameters,_std::allocator<DIS::IntercomCommunicationsParameters>_>
            ::size(&this->_intercomParameters);
    if (sVar2 <= (ulong)uVar1) break;
    pvVar3 = std::
             vector<DIS::IntercomCommunicationsParameters,_std::allocator<DIS::IntercomCommunicationsParameters>_>
             ::operator[](&this->_intercomParameters,x._8_8_);
    IntercomCommunicationsParameters::IntercomCommunicationsParameters
              ((IntercomCommunicationsParameters *)local_30,pvVar3);
    IntercomCommunicationsParameters::marshal
              ((IntercomCommunicationsParameters *)local_30,dataStream);
    IntercomCommunicationsParameters::~IntercomCommunicationsParameters
              ((IntercomCommunicationsParameters *)local_30);
    x._8_8_ = x._8_8_ + 1;
  }
  return;
}

Assistant:

void IntercomControlPdu::marshal(DataStream& dataStream) const
{
    RadioCommunicationsFamilyPdu::marshal(dataStream); // Marshal information in superclass first
    dataStream << _controlType;
    dataStream << _communicationsChannelType;
    _sourceEntityID.marshal(dataStream);
    dataStream << _sourceCommunicationsDeviceID;
    dataStream << _sourceLineID;
    dataStream << _transmitPriority;
    dataStream << _transmitLineState;
    dataStream << _command;
    _masterEntityID.marshal(dataStream);
    dataStream << _masterCommunicationsDeviceID;
    dataStream << ( unsigned int )_intercomParameters.size();

     for(size_t idx = 0; idx < _intercomParameters.size(); idx++)
     {
        IntercomCommunicationsParameters x = _intercomParameters[idx];
        x.marshal(dataStream);
     }

}